

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool basist::transcode_uastc_to_pvrtc1_4_rgba
               (uastc_block *pSrc_blocks,void *pDst_blocks,uint32_t num_blocks_x,
               uint32_t num_blocks_y,bool high_quality)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  unkuint9 Var11;
  unkbyte10 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  unkuint10 Var18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar30 [12];
  undefined1 auVar31 [14];
  undefined1 auVar32 [14];
  undefined1 auVar33 [12];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  byte bVar47;
  pvrtc4_block pVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [15];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [15];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [15];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [15];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [15];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [15];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  anon_union_4_3_898e29d3_for_color32_0 aVar114;
  anon_union_4_3_898e29d3_for_color32_0 aVar115;
  anon_union_4_3_898e29d3_for_color32_0 aVar116;
  anon_union_4_3_898e29d3_for_color32_0 aVar117;
  uint32_t *puVar118;
  uint32_t *puVar119;
  bool bVar120;
  uint32_t uVar121;
  uint32_t uVar122;
  uint32_t uVar123;
  uint32_t uVar124;
  uint uVar125;
  anon_union_4_3_898e29d3_for_color32_0 aVar126;
  uint32_t uVar127;
  anon_union_4_3_898e29d3_for_color32_0 aVar128;
  uint32_t uVar129;
  anon_union_4_3_898e29d3_for_color32_0 aVar130;
  uint32_t uVar131;
  uint *puVar132;
  byte bVar133;
  uint uVar134;
  uint uVar135;
  int iVar136;
  int iVar137;
  uint uVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  uint uVar142;
  anon_union_4_3_898e29d3_for_color32_0 aVar143;
  int iVar144;
  int iVar145;
  uint uVar146;
  long lVar147;
  uint32_t x;
  uint uVar148;
  int iVar149;
  int iVar150;
  uint uVar151;
  ulong uVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  uint uVar158;
  uint32_t v;
  int iVar159;
  int iVar160;
  uint uVar161;
  int iVar162;
  uint uVar163;
  uint uVar164;
  uint uVar165;
  int iVar166;
  int iVar167;
  uint uVar168;
  anon_union_4_3_898e29d3_for_color32_0 aVar169;
  int iVar170;
  uint uVar171;
  pvrtc4_block pVar172;
  int iVar173;
  int iVar174;
  int iVar175;
  uint uVar176;
  pvrtc4_block *ppVar177;
  int iVar178;
  int iVar179;
  ulong uVar180;
  long lVar181;
  int iVar182;
  int iVar183;
  int iVar184;
  uint uVar185;
  int iVar186;
  int iVar187;
  int iVar188;
  color32 *pcVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  ulong local_290;
  anon_union_4_3_898e29d3_for_color32_0 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  byte bStack_170;
  byte bStack_16f;
  byte bStack_16e;
  byte bStack_16d;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  pvrtc4_block temp;
  uint32_t local_150;
  uint local_148;
  uint local_144;
  uint32_t local_140;
  color32 block_pixels [16];
  vector<unsigned_int> temp_endpoints;
  uint32_t *pE_rows [3];
  undefined1 uVar193;
  undefined1 uVar194;
  undefined1 uVar195;
  
  if ((num_blocks_y == 0 || num_blocks_x == 0) ||
     (uVar134 = num_blocks_x * 4 - 1, (num_blocks_x * 4 ^ uVar134) <= uVar134)) {
    uVar134 = 0;
  }
  else {
    uVar135 = num_blocks_y * 4 - 1;
    uVar134 = 0;
    if (uVar135 < (num_blocks_y * 4 ^ uVar135)) {
      basisu::vector<unsigned_int>::vector(&temp_endpoints,(ulong)(num_blocks_y * num_blocks_x));
      while( true ) {
        if (uVar134 == num_blocks_y) break;
        for (uVar152 = 0; uVar152 != num_blocks_x; uVar152 = uVar152 + 1) {
          uVar180 = (ulong)(uVar134 * num_blocks_x + (int)uVar152);
          bVar120 = unpack_uastc(pSrc_blocks + uVar180,block_pixels,false);
          if (!bVar120) {
            uVar134 = (uint)(num_blocks_y <= uVar134);
            goto LAB_00129b9e;
          }
          local_198.m = 0xffffffff;
          pE_rows[0]._0_4_ = 0;
          for (lVar147 = 0; lVar147 != 0x40; lVar147 = lVar147 + 4) {
            pcVar189 = (color32 *)((long)&block_pixels[0].field_0 + lVar147);
            local_198.field_0 =
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                 color32::comp_min((color32 *)&local_198.field_0,pcVar189);
            pE_rows[0]._0_4_ =
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                 color32::comp_max((color32 *)pE_rows,pcVar189);
          }
          temp.m_modulation = 0;
          temp.m_endpoints = 0;
          pvrtc4_block::set_endpoint_floor(&temp,0,(color32 *)&local_198.field_0);
          pvrtc4_block::set_endpoint_ceil(&temp,1,(color32 *)pE_rows);
          uVar122 = temp.m_endpoints;
          puVar132 = basisu::vector<unsigned_int>::operator[](&temp_endpoints,uVar180);
          *puVar132 = uVar122;
        }
        uVar134 = uVar134 + 1;
      }
      uVar152 = 0;
      puVar132 = basisu::vector<unsigned_int>::operator[](&temp_endpoints,0);
      v = num_blocks_x - 1;
      uVar121 = basisu::total_bits(v);
      uVar122 = basisu::total_bits(num_blocks_y - 1);
      if (uVar121 < uVar122) {
        uVar122 = uVar121;
      }
      bVar47 = (byte)uVar122;
      bVar133 = bVar47 * '\x02';
      uVar122 = 0;
      if (0 < (int)num_blocks_x) {
        uVar122 = num_blocks_x;
      }
      uVar121 = 0;
      if (0 < (int)num_blocks_y) {
        uVar121 = num_blocks_y;
      }
      uVar134 = 0;
      while (uVar135 = (uint)uVar152, ppVar177 = &temp, uVar135 != uVar121) {
        pcVar189 = block_pixels;
        for (lVar147 = 0; puVar119 = pE_rows[2], puVar118 = pE_rows[1], lVar147 != 3;
            lVar147 = lVar147 + 1) {
          pE_rows[lVar147] =
               puVar132 + ((uVar135 - 1) + (int)lVar147 & num_blocks_y - 1) * num_blocks_x;
          uVar148 = 0xffffffff;
          for (lVar181 = 0; lVar181 != 0x30; lVar181 = lVar181 + 0x10) {
            uVar124 = (puVar132 + ((uVar135 - 1) + (int)lVar147 & num_blocks_y - 1) * num_blocks_x)
                      [uVar148 & v];
            uVar123 = get_endpoint_l8(uVar124,0);
            *(uint32_t *)((long)&pcVar189->field_0 + lVar181) = uVar123;
            uVar124 = get_endpoint_l8(uVar124,1);
            *(uint32_t *)((long)&ppVar177->m_modulation + lVar181) = uVar124;
            uVar148 = uVar148 + 1;
          }
          ppVar177 = (pvrtc4_block *)&ppVar177->m_endpoints;
          pcVar189 = pcVar189 + 1;
        }
        uVar1 = (&g_pvrtc_swizzle_table)[uVar152 >> 8];
        uVar2 = (&g_pvrtc_swizzle_table)[uVar152 & 0xff];
        lVar147 = CONCAT44(pE_rows[0]._4_4_,pE_rows[0]._0_4_);
        uVar152 = 0;
        aVar126 = block_pixels[8].field_0;
        local_290 = (ulong)temp >> 0x20;
        pVar48 = temp;
        aVar114 = block_pixels[0].field_0;
        aVar169 = block_pixels[4].field_0;
        aVar115 = block_pixels[1].field_0;
        aVar143 = block_pixels[5].field_0;
        aVar128 = block_pixels[9].field_0;
        aVar130 = block_pixels[10].field_0;
        aVar116 = block_pixels[2].field_0;
        aVar117 = block_pixels[6].field_0;
        while( true ) {
          pVar172.m_endpoints = 0;
          pVar172.m_modulation = local_148;
          uVar123 = pVar48.m_modulation;
          uVar148 = (uint)uVar152;
          uVar165 = uVar134 + uVar148;
          uVar124 = (uint32_t)local_290;
          if (uVar122 == uVar148) break;
          unpack_uastc(pSrc_blocks + uVar165,(color32 *)&local_198.field_0,false);
          uVar125 = (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar152 & 0xff] * 2 |
                    (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar152 >> 8] << 0x11 |
                    CONCAT22(uVar1,uVar2);
          if (num_blocks_x != num_blocks_y) {
            uVar125 = uVar125 & ~(-1 << (bVar133 & 0x1f));
            if (num_blocks_y < num_blocks_x) {
              uVar125 = uVar125 | (uVar148 >> (bVar47 & 0x1f)) << (bVar133 & 0x1f);
            }
            else {
              uVar125 = uVar125 | (uVar135 >> (bVar47 & 0x1f)) << (bVar133 & 0x1f);
            }
          }
          *(uint *)((long)pDst_blocks + (ulong)uVar125 * 8 + 4) = puVar132[uVar165];
          uVar152 = (ulong)(uVar148 + 1);
          lVar181 = (long)(int)(uVar148 + 1 & v);
          uVar131 = *(uint32_t *)(lVar147 + lVar181 * 4);
          aVar126.m = get_endpoint_l8(uVar131,0);
          uVar127 = get_endpoint_l8(uVar131,1);
          uVar131 = puVar118[lVar181];
          aVar128.m = get_endpoint_l8(uVar131,0);
          uVar129 = get_endpoint_l8(uVar131,1);
          uVar131 = puVar119[lVar181];
          aVar130.m = get_endpoint_l8(uVar131,0);
          uVar131 = get_endpoint_l8(uVar131,1);
          iVar136 = aVar128.m * 3 + aVar143.m * 9;
          iVar144 = uVar129 * 3 + local_144 * 9;
          iVar139 = aVar117.m * 3 + aVar130.m + iVar136;
          iVar182 = local_140 * 3 + uVar131 + iVar144;
          uVar195 = (undefined1)((uint)uStack_15c >> 0x18);
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar195);
          auVar50._10_6_ = 0;
          auVar50._0_10_ = Var18;
          uVar194 = (undefined1)((uint)uStack_15c >> 0x10);
          auVar190._5_11_ = SUB1611(auVar50 << 0x30,5);
          auVar190[4] = uVar194;
          auVar190._0_4_ = uStack_15c;
          auVar49._12_4_ = 0;
          auVar49._0_12_ = auVar190._4_12_;
          uVar193 = (undefined1)((uint)uStack_15c >> 8);
          auVar17._1_13_ = SUB1613(auVar49 << 0x20,3);
          auVar17[0] = uVar193;
          iVar149 = (uint)(ushort)((short)Var18 + auVar17._0_2_ +
                                  auVar190._4_2_ + (ushort)(byte)uStack_15c) * 0x100 +
                    iVar139 * -0x10;
          if (iVar182 < iVar139) {
            iVar149 = -iVar149;
          }
          iVar3 = iVar182 - iVar139;
          if (iVar182 < iVar139) {
            iVar3 = -(iVar182 - iVar139);
          }
          iVar139 = aVar143.m * 0xc;
          iVar178 = local_144 * 0xc;
          iVar182 = iVar139 + aVar117.m * 4;
          iVar173 = iVar178 + local_140 * 4;
          uVar180 = CONCAT44(uStack_15c,uStack_160);
          auVar40._8_6_ = 0;
          auVar40._0_8_ = uVar180;
          auVar40[0xe] = uVar195;
          auVar53._8_4_ = 0;
          auVar53._0_8_ = uVar180;
          auVar53[0xc] = uVar194;
          auVar53._13_2_ = auVar40._13_2_;
          auVar86._8_4_ = 0;
          auVar86._0_8_ = uVar180;
          auVar86._12_3_ = auVar53._12_3_;
          auVar93._8_2_ = 0;
          auVar93._0_8_ = uVar180;
          auVar93[10] = uVar193;
          auVar93._11_4_ = auVar86._11_4_;
          auVar100._8_2_ = 0;
          auVar100._0_8_ = uVar180;
          auVar100._10_5_ = auVar93._10_5_;
          auVar107[8] = (byte)uStack_15c;
          auVar107._0_8_ = uVar180;
          auVar107._9_6_ = auVar100._9_6_;
          Var18 = CONCAT91(SUB169(ZEXT716(auVar107._8_7_) << 0x40,7),
                           (char)((uint)uStack_160 >> 0x18));
          auVar52._10_6_ = 0;
          auVar52._0_10_ = Var18;
          auVar20._1_11_ = SUB1611(auVar52 << 0x30,5);
          auVar20[0] = (char)((uint)uStack_160 >> 0x10);
          auVar51._12_4_ = 0;
          auVar51._0_12_ = auVar20;
          auVar19._1_13_ = SUB1613(auVar51 << 0x20,3);
          auVar19[0] = (char)((uint)uStack_160 >> 8);
          iVar183 = (uint)(ushort)((short)Var18 + auVar19._0_2_ +
                                  auVar20._0_2_ + (ushort)(byte)uStack_160) * 0x100 +
                    iVar182 * -0x10;
          if (iVar173 < iVar182) {
            iVar183 = -iVar183;
          }
          iVar140 = iVar139 + aVar128.m * 4;
          iVar184 = iVar178 + uVar129 * 4;
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),(char)((uint)uStack_16c >> 0x18));
          auVar55._10_6_ = 0;
          auVar55._0_10_ = Var18;
          auVar191._5_11_ = SUB1611(auVar55 << 0x30,5);
          auVar191[4] = (char)((uint)uStack_16c >> 0x10);
          auVar191._0_4_ = uStack_16c;
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar191._4_12_;
          auVar21._1_13_ = SUB1613(auVar54 << 0x20,3);
          auVar21[0] = (char)((uint)uStack_16c >> 8);
          iVar4 = iVar173 - iVar182;
          if (iVar173 < iVar182) {
            iVar4 = -(iVar173 - iVar182);
          }
          iVar182 = (uint)(ushort)((short)Var18 + auVar21._0_2_ +
                                  auVar191._4_2_ + (ushort)(byte)uStack_16c) * 0x100 +
                    iVar140 * -0x10;
          if (iVar184 < iVar140) {
            iVar182 = -iVar182;
          }
          iVar173 = iVar184 - iVar140;
          if (iVar184 < iVar140) {
            iVar173 = -(iVar184 - iVar140);
          }
          iVar184 = local_144 * 0x10;
          iVar186 = (uint)bStack_16e + (uint)bStack_16f + ((uint)bStack_170 - (int)aVar143) +
                    (uint)bStack_16d;
          iVar187 = iVar186 * 0x100;
          iVar140 = iVar184 + aVar143.m * -0x10;
          if (SBORROW4(iVar184,aVar143.m * 0x10) != iVar140 < 0) {
            iVar187 = iVar186 * -0x100;
          }
          iVar186 = iVar184 + aVar143.m * -0x10;
          if (SBORROW4(iVar184,aVar143.m * 0x10) != iVar186 < 0) {
            iVar186 = -iVar140;
          }
          iVar141 = aVar115.m * 3 + aVar143.m * 9;
          iVar174 = uVar124 * 3 + local_144 * 9;
          iVar184 = aVar117.m * 3 + aVar116.m + iVar141;
          iVar153 = local_140 * 3 + local_150 + iVar174;
          uVar195 = (undefined1)((uint)uStack_164 >> 0x18);
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar195);
          auVar57._10_6_ = 0;
          auVar57._0_10_ = Var18;
          uVar194 = (undefined1)((uint)uStack_164 >> 0x10);
          auVar192._5_11_ = SUB1611(auVar57 << 0x30,5);
          auVar192[4] = uVar194;
          auVar192._0_4_ = uStack_164;
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar192._4_12_;
          uVar193 = (undefined1)((uint)uStack_164 >> 8);
          auVar22._1_13_ = SUB1613(auVar56 << 0x20,3);
          auVar22[0] = uVar193;
          iVar140 = iVar153 - iVar184;
          if (iVar153 < iVar184) {
            iVar140 = -(iVar153 - iVar184);
          }
          iVar150 = (uint)(ushort)((short)Var18 + auVar22._0_2_ +
                                  auVar192._4_2_ + (ushort)(byte)uStack_164) * 0x100 +
                    iVar184 * -0x10;
          if (iVar153 < iVar184) {
            iVar150 = -iVar150;
          }
          iVar159 = aVar115.m + aVar143.m;
          iVar154 = uVar124 + local_144;
          iVar153 = iVar159 * 6 + (aVar116.m + aVar117.m) * 2;
          iVar155 = iVar154 * 6 + (local_150 + local_140) * 2;
          auVar7._8_4_ = uStack_190;
          auVar7._0_8_ = CONCAT44(uStack_194,local_198.m);
          auVar6._12_4_ = uStack_18c;
          auVar6._0_12_ = auVar7;
          auVar9._8_4_ = uStack_180;
          auVar9._0_8_ = CONCAT44(uStack_184,local_188);
          auVar8._12_4_ = uStack_17c;
          auVar8._0_12_ = auVar9;
          auVar16._8_4_ = uStack_160;
          auVar16._0_8_ = CONCAT44(uStack_164,local_168);
          auVar15._12_4_ = uStack_15c;
          auVar15._0_12_ = auVar16;
          auVar41[0xd] = 0;
          auVar41._0_13_ = auVar15._0_13_;
          auVar41[0xe] = uVar195;
          auVar60[0xc] = uVar194;
          auVar60._0_12_ = auVar16;
          auVar60._13_2_ = auVar41._13_2_;
          auVar87[0xb] = 0;
          auVar87._0_11_ = auVar16._0_11_;
          auVar87._12_3_ = auVar60._12_3_;
          auVar94[10] = uVar193;
          auVar94._0_10_ = auVar16._0_10_;
          auVar94._11_4_ = auVar87._11_4_;
          auVar101[9] = 0;
          auVar101._0_9_ = auVar16._0_9_;
          auVar101._10_5_ = auVar94._10_5_;
          auVar108[8] = (byte)uStack_164;
          auVar108._0_8_ = CONCAT44(uStack_164,local_168);
          auVar108._9_6_ = auVar101._9_6_;
          Var18 = CONCAT91(SUB169(ZEXT716(auVar108._8_7_) << 0x40,7),(char)((uint)local_168 >> 0x18)
                          );
          auVar59._10_6_ = 0;
          auVar59._0_10_ = Var18;
          auVar24._1_11_ = SUB1611(auVar59 << 0x30,5);
          auVar24[0] = (char)((uint)local_168 >> 0x10);
          auVar58._12_4_ = 0;
          auVar58._0_12_ = auVar24;
          auVar23._1_13_ = SUB1613(auVar58 << 0x20,3);
          auVar23[0] = (char)((uint)local_168 >> 8);
          Var11 = CONCAT18(bStack_170,CONCAT44(uStack_174,local_178));
          Var12 = CONCAT19(bStack_16f,Var11);
          auVar13[10] = bStack_16e;
          auVar13._0_10_ = Var12;
          auVar14[0xb] = bStack_16d;
          auVar14._0_11_ = auVar13;
          auVar10._12_4_ = uStack_16c;
          auVar10._0_12_ = auVar14;
          iVar184 = iVar155 - iVar153;
          if (iVar155 < iVar153) {
            iVar184 = -(iVar155 - iVar153);
          }
          iVar188 = (uint)(ushort)((short)Var18 + auVar23._0_2_ +
                                  auVar24._0_2_ + (ushort)(byte)local_168) * 0x100 + iVar153 * -0x10
          ;
          if (iVar155 < iVar153) {
            iVar188 = -iVar188;
          }
          iVar155 = iVar139 + aVar115.m * 4;
          iVar156 = iVar178 + uVar124 * 4;
          uVar195 = (undefined1)((uint)uStack_174 >> 0x18);
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar195);
          auVar62._10_6_ = 0;
          auVar62._0_10_ = Var18;
          uVar194 = (undefined1)((uint)uStack_174 >> 0x10);
          auVar200._5_11_ = SUB1611(auVar62 << 0x30,5);
          auVar200[4] = uVar194;
          auVar200._0_4_ = uStack_174;
          auVar61._12_4_ = 0;
          auVar61._0_12_ = auVar200._4_12_;
          uVar193 = (undefined1)((uint)uStack_174 >> 8);
          auVar25._1_13_ = SUB1613(auVar61 << 0x20,3);
          auVar25[0] = uVar193;
          iVar153 = iVar156 - iVar155;
          if (iVar156 < iVar155) {
            iVar153 = -(iVar156 - iVar155);
          }
          iVar166 = (uint)(ushort)((short)Var18 + auVar25._0_2_ +
                                  auVar200._4_2_ + (ushort)(byte)uStack_174) * 0x100 +
                    iVar155 * -0x10;
          if (iVar156 < iVar155) {
            iVar166 = -iVar166;
          }
          iVar156 = iVar154 * 8;
          auVar42[0xd] = 0;
          auVar42._0_13_ = auVar10._0_13_;
          auVar42[0xe] = uVar195;
          auVar65[0xc] = uVar194;
          auVar65._0_12_ = auVar14;
          auVar65._13_2_ = auVar42._13_2_;
          auVar88[0xb] = 0;
          auVar88._0_11_ = auVar13;
          auVar88._12_3_ = auVar65._12_3_;
          auVar95[10] = uVar193;
          auVar95._0_10_ = Var12;
          auVar95._11_4_ = auVar88._11_4_;
          auVar102[9] = 0;
          auVar102._0_9_ = Var11;
          auVar102._10_5_ = auVar95._10_5_;
          auVar109[8] = (byte)uStack_174;
          auVar109._0_8_ = CONCAT44(uStack_174,local_178);
          auVar109._9_6_ = auVar102._9_6_;
          Var18 = CONCAT91(SUB169(ZEXT716(auVar109._8_7_) << 0x40,7),(char)((uint)local_178 >> 0x18)
                          );
          auVar64._10_6_ = 0;
          auVar64._0_10_ = Var18;
          auVar27._1_11_ = SUB1611(auVar64 << 0x30,5);
          auVar27[0] = (char)((uint)local_178 >> 0x10);
          auVar63._12_4_ = 0;
          auVar63._0_12_ = auVar27;
          auVar26._1_13_ = SUB1613(auVar63 << 0x20,3);
          auVar26[0] = (char)((uint)local_178 >> 8);
          iVar155 = iVar156 + iVar159 * -8;
          if (SBORROW4(iVar156,iVar159 * 8) != iVar155 < 0) {
            iVar155 = -(iVar156 + iVar159 * -8);
          }
          iVar167 = (uint)(ushort)((short)Var18 + auVar26._0_2_ +
                                  auVar27._0_2_ + (ushort)(byte)local_178) * 0x100 + iVar159 * -0x80
          ;
          if (SBORROW4(iVar156,iVar159 * 8) != iVar156 + iVar159 * -8 < 0) {
            iVar167 = -iVar167;
          }
          iVar156 = iVar136 + aVar126.m + aVar169.m * 3;
          iVar144 = iVar144 + uVar127 + local_148 * 3;
          uVar195 = (undefined1)((uint)uStack_17c >> 0x18);
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar195);
          auVar67._10_6_ = 0;
          auVar67._0_10_ = Var18;
          uVar194 = (undefined1)((uint)uStack_17c >> 0x10);
          auVar197._5_11_ = SUB1611(auVar67 << 0x30,5);
          auVar197[4] = uVar194;
          auVar197._0_4_ = uStack_17c;
          auVar66._12_4_ = 0;
          auVar66._0_12_ = auVar197._4_12_;
          uVar193 = (undefined1)((uint)uStack_17c >> 8);
          auVar28._1_13_ = SUB1613(auVar66 << 0x20,3);
          auVar28[0] = uVar193;
          iVar136 = iVar144 - iVar156;
          if (iVar144 < iVar156) {
            iVar136 = -(iVar144 - iVar156);
          }
          iVar162 = (uint)(ushort)((short)Var18 + auVar28._0_2_ +
                                  auVar197._4_2_ + (ushort)(byte)uStack_17c) * 0x100 +
                    iVar156 * -0x10;
          if (iVar144 < iVar156) {
            iVar162 = -iVar162;
          }
          iVar139 = iVar139 + aVar169.m * 4;
          iVar178 = iVar178 + local_148 * 4;
          uVar180 = CONCAT44(uStack_17c,uStack_180);
          auVar43._8_6_ = 0;
          auVar43._0_8_ = uVar180;
          auVar43[0xe] = uVar195;
          auVar70._8_4_ = 0;
          auVar70._0_8_ = uVar180;
          auVar70[0xc] = uVar194;
          auVar70._13_2_ = auVar43._13_2_;
          auVar89._8_4_ = 0;
          auVar89._0_8_ = uVar180;
          auVar89._12_3_ = auVar70._12_3_;
          auVar96._8_2_ = 0;
          auVar96._0_8_ = uVar180;
          auVar96[10] = uVar193;
          auVar96._11_4_ = auVar89._11_4_;
          auVar103._8_2_ = 0;
          auVar103._0_8_ = uVar180;
          auVar103._10_5_ = auVar96._10_5_;
          auVar110[8] = (byte)uStack_17c;
          auVar110._0_8_ = uVar180;
          auVar110._9_6_ = auVar103._9_6_;
          Var18 = CONCAT91(SUB169(ZEXT716(auVar110._8_7_) << 0x40,7),
                           (char)((uint)uStack_180 >> 0x18));
          auVar69._10_6_ = 0;
          auVar69._0_10_ = Var18;
          auVar30._1_11_ = SUB1611(auVar69 << 0x30,5);
          auVar30[0] = (char)((uint)uStack_180 >> 0x10);
          auVar68._12_4_ = 0;
          auVar68._0_12_ = auVar30;
          auVar29._1_13_ = SUB1613(auVar68 << 0x20,3);
          auVar29[0] = (char)((uint)uStack_180 >> 8);
          iVar144 = iVar178 - iVar139;
          if (iVar178 < iVar139) {
            iVar144 = -(iVar178 - iVar139);
          }
          iVar156 = (uint)(ushort)((short)Var18 + auVar29._0_2_ +
                                  auVar30._0_2_ + (ushort)(byte)uStack_180) * 0x100 +
                    iVar139 * -0x10;
          if (iVar178 < iVar139) {
            iVar156 = -iVar156;
          }
          iVar160 = aVar169.m + aVar143.m;
          iVar178 = (local_148 + local_144) * 6;
          iVar137 = iVar160 * 6 + (aVar128.m + aVar126.m) * 2;
          iVar139 = iVar178 + (uVar127 + uVar129) * 2;
          uVar195 = (undefined1)((uint)uStack_18c >> 0x18);
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar195);
          auVar72._10_6_ = 0;
          auVar72._0_10_ = Var18;
          uVar194 = (undefined1)((uint)uStack_18c >> 0x10);
          auVar198._5_11_ = SUB1611(auVar72 << 0x30,5);
          auVar198[4] = uVar194;
          auVar198._0_4_ = uStack_18c;
          auVar71._12_4_ = 0;
          auVar71._0_12_ = auVar198._4_12_;
          uVar193 = (undefined1)((uint)uStack_18c >> 8);
          auVar31._1_13_ = SUB1613(auVar71 << 0x20,3);
          auVar31[0] = uVar193;
          iVar5 = iVar139 - iVar137;
          if (iVar139 < iVar137) {
            iVar5 = -(iVar139 - iVar137);
          }
          iVar179 = (uint)(ushort)((short)Var18 + auVar31._0_2_ +
                                  auVar198._4_2_ + (ushort)(byte)uStack_18c) * 0x100 +
                    iVar137 * -0x10;
          if (iVar139 < iVar137) {
            iVar179 = -iVar179;
          }
          iVar137 = (local_148 + local_144) * 8;
          iVar139 = iVar137 + iVar160 * -8;
          uVar180 = CONCAT44(uStack_18c,uStack_190);
          auVar44._8_6_ = 0;
          auVar44._0_8_ = uVar180;
          auVar44[0xe] = uVar195;
          auVar75._8_4_ = 0;
          auVar75._0_8_ = uVar180;
          auVar75[0xc] = uVar194;
          auVar75._13_2_ = auVar44._13_2_;
          auVar90._8_4_ = 0;
          auVar90._0_8_ = uVar180;
          auVar90._12_3_ = auVar75._12_3_;
          auVar97._8_2_ = 0;
          auVar97._0_8_ = uVar180;
          auVar97[10] = uVar193;
          auVar97._11_4_ = auVar90._11_4_;
          auVar104._8_2_ = 0;
          auVar104._0_8_ = uVar180;
          auVar104._10_5_ = auVar97._10_5_;
          auVar111[8] = (byte)uStack_18c;
          auVar111._0_8_ = uVar180;
          auVar111._9_6_ = auVar104._9_6_;
          Var18 = CONCAT91(SUB169(ZEXT716(auVar111._8_7_) << 0x40,7),
                           (char)((uint)uStack_190 >> 0x18));
          auVar74._10_6_ = 0;
          auVar74._0_10_ = Var18;
          auVar33._1_11_ = SUB1611(auVar74 << 0x30,5);
          auVar33[0] = (char)((uint)uStack_190 >> 0x10);
          auVar73._12_4_ = 0;
          auVar73._0_12_ = auVar33;
          auVar32._1_13_ = SUB1613(auVar73 << 0x20,3);
          auVar32[0] = (char)((uint)uStack_190 >> 8);
          if (SBORROW4(iVar137,iVar160 * 8) != iVar139 < 0) {
            iVar139 = -(iVar137 + iVar160 * -8);
          }
          iVar157 = (uint)(ushort)((short)Var18 + auVar32._0_2_ +
                                  auVar33._0_2_ + (ushort)(byte)uStack_190) * 0x100 +
                    iVar160 * -0x80;
          if (SBORROW4(iVar137,iVar160 * 8) != iVar137 + iVar160 * -8 < 0) {
            iVar157 = -iVar157;
          }
          iVar141 = iVar141 + aVar169.m * 3 + aVar114.m;
          iVar174 = iVar174 + local_148 * 3 + uVar123;
          uVar195 = (undefined1)((uint)uStack_184 >> 0x18);
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar195);
          auVar77._10_6_ = 0;
          auVar77._0_10_ = Var18;
          uVar194 = (undefined1)((uint)uStack_184 >> 0x10);
          auVar199._5_11_ = SUB1611(auVar77 << 0x30,5);
          auVar199[4] = uVar194;
          auVar199._0_4_ = uStack_184;
          auVar76._12_4_ = 0;
          auVar76._0_12_ = auVar199._4_12_;
          uVar193 = (undefined1)((uint)uStack_184 >> 8);
          auVar34._1_13_ = SUB1613(auVar76 << 0x20,3);
          auVar34[0] = uVar193;
          iVar137 = iVar174 - iVar141;
          if (iVar174 < iVar141) {
            iVar137 = -(iVar174 - iVar141);
          }
          iVar170 = (uint)(ushort)((short)Var18 + auVar34._0_2_ +
                                  auVar199._4_2_ + (ushort)(byte)uStack_184) * 0x100 +
                    iVar141 * -0x10;
          if (iVar174 < iVar141) {
            iVar170 = -iVar170;
          }
          iVar174 = iVar159 * 6 + (aVar114.m + aVar169.m) * 2;
          iVar145 = iVar154 * 6 + (uVar123 + local_148) * 2;
          auVar45[0xd] = 0;
          auVar45._0_13_ = auVar8._0_13_;
          auVar45[0xe] = uVar195;
          auVar80[0xc] = uVar194;
          auVar80._0_12_ = auVar9;
          auVar80._13_2_ = auVar45._13_2_;
          auVar91[0xb] = 0;
          auVar91._0_11_ = auVar9._0_11_;
          auVar91._12_3_ = auVar80._12_3_;
          auVar98[10] = uVar193;
          auVar98._0_10_ = auVar9._0_10_;
          auVar98._11_4_ = auVar91._11_4_;
          auVar105[9] = 0;
          auVar105._0_9_ = auVar9._0_9_;
          auVar105._10_5_ = auVar98._10_5_;
          auVar112[8] = (byte)uStack_184;
          auVar112._0_8_ = CONCAT44(uStack_184,local_188);
          auVar112._9_6_ = auVar105._9_6_;
          Var18 = CONCAT91(SUB169(ZEXT716(auVar112._8_7_) << 0x40,7),(char)((uint)local_188 >> 0x18)
                          );
          auVar79._10_6_ = 0;
          auVar79._0_10_ = Var18;
          auVar36._1_11_ = SUB1611(auVar79 << 0x30,5);
          auVar36[0] = (char)((uint)local_188 >> 0x10);
          auVar78._12_4_ = 0;
          auVar78._0_12_ = auVar36;
          auVar35._1_13_ = SUB1613(auVar78 << 0x20,3);
          auVar35[0] = (char)((uint)local_188 >> 8);
          iVar141 = iVar145 - iVar174;
          if (iVar145 < iVar174) {
            iVar141 = -(iVar145 - iVar174);
          }
          iVar175 = (uint)(ushort)((short)Var18 + auVar35._0_2_ +
                                  auVar36._0_2_ + (ushort)(byte)local_188) * 0x100 + iVar174 * -0x10
          ;
          if (iVar145 < iVar174) {
            iVar175 = -iVar175;
          }
          iVar160 = iVar160 * 6 + (aVar114.m + aVar115.m) * 2;
          iVar178 = iVar178 + (uVar123 + uVar124) * 2;
          uVar195 = (undefined1)((uint)uStack_194 >> 0x18);
          Var18 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar195);
          auVar82._10_6_ = 0;
          auVar82._0_10_ = Var18;
          uVar194 = (undefined1)((uint)uStack_194 >> 0x10);
          auVar196._5_11_ = SUB1611(auVar82 << 0x30,5);
          auVar196[4] = uVar194;
          auVar196._0_4_ = uStack_194;
          auVar81._12_4_ = 0;
          auVar81._0_12_ = auVar196._4_12_;
          uVar193 = (undefined1)((uint)uStack_194 >> 8);
          auVar37._1_13_ = SUB1613(auVar81 << 0x20,3);
          auVar37[0] = uVar193;
          iVar174 = iVar178 - iVar160;
          if (iVar178 < iVar160) {
            iVar174 = -(iVar178 - iVar160);
          }
          iVar145 = (uint)(ushort)((short)Var18 + auVar37._0_2_ +
                                  auVar196._4_2_ + (ushort)(byte)uStack_194) * 0x100 +
                    iVar160 * -0x10;
          if (iVar178 < iVar160) {
            iVar145 = -iVar145;
          }
          iVar159 = aVar114.m + aVar169.m + iVar159;
          iVar154 = (uVar123 + local_148 + iVar154) * 4;
          iVar178 = iVar154 + iVar159 * -4;
          auVar46[0xd] = 0;
          auVar46._0_13_ = auVar6._0_13_;
          auVar46[0xe] = uVar195;
          auVar85[0xc] = uVar194;
          auVar85._0_12_ = auVar7;
          auVar85._13_2_ = auVar46._13_2_;
          auVar92[0xb] = 0;
          auVar92._0_11_ = auVar7._0_11_;
          auVar92._12_3_ = auVar85._12_3_;
          auVar99[10] = uVar193;
          auVar99._0_10_ = auVar7._0_10_;
          auVar99._11_4_ = auVar92._11_4_;
          auVar106[9] = 0;
          auVar106._0_9_ = auVar7._0_9_;
          auVar106._10_5_ = auVar99._10_5_;
          auVar113[8] = (byte)uStack_194;
          auVar113._0_8_ = CONCAT44(uStack_194,local_198.m);
          auVar113._9_6_ = auVar106._9_6_;
          Var18 = CONCAT91(SUB169(ZEXT716(auVar113._8_7_) << 0x40,7),local_198.field_0.a);
          auVar84._10_6_ = 0;
          auVar84._0_10_ = Var18;
          auVar39._1_11_ = SUB1611(auVar84 << 0x30,5);
          auVar39[0] = local_198.field_0.b;
          auVar83._12_4_ = 0;
          auVar83._0_12_ = auVar39;
          auVar38._1_13_ = SUB1613(auVar83 << 0x20,3);
          auVar38[0] = local_198.field_0.g;
          if (SBORROW4(iVar154,iVar159 * 4) != iVar178 < 0) {
            iVar178 = -(iVar154 + iVar159 * -4);
          }
          iVar160 = (uint)(ushort)((short)Var18 + auVar38._0_2_ +
                                  auVar39._0_2_ + (ushort)local_198.field_0.r) * 0x100 +
                    iVar159 * -0x40;
          if (SBORROW4(iVar154,iVar159 * 4) != iVar154 + iVar159 * -4 < 0) {
            iVar160 = -iVar160;
          }
          uVar148 = 2;
          if (iVar160 == iVar178 * 8 || SBORROW4(iVar160,iVar178 * 8) != iVar160 + iVar178 * -8 < 0)
          {
            uVar148 = (uint)(iVar160 != iVar178 * 3 &&
                            SBORROW4(iVar160,iVar178 * 3) == iVar160 + iVar178 * -3 < 0);
          }
          uVar165 = 3;
          if (iVar160 <= iVar178 * 0xd) {
            uVar165 = uVar148;
          }
          iVar178 = 8;
          if (iVar145 == iVar174 * 8 || SBORROW4(iVar145,iVar174 * 8) != iVar145 + iVar174 * -8 < 0)
          {
            iVar178 = (uint)(iVar145 != iVar174 * 3 &&
                            SBORROW4(iVar145,iVar174 * 3) == iVar145 + iVar174 * -3 < 0) << 2;
          }
          iVar154 = 0xc;
          if (iVar145 <= iVar174 * 0xd) {
            iVar154 = iVar178;
          }
          iVar178 = 0x200;
          if (iVar175 == iVar141 * 8 || SBORROW4(iVar175,iVar141 * 8) != iVar175 + iVar141 * -8 < 0)
          {
            iVar178 = (uint)(iVar175 != iVar141 * 3 &&
                            SBORROW4(iVar175,iVar141 * 3) == iVar175 + iVar141 * -3 < 0) << 8;
          }
          iVar174 = 0x300;
          if (iVar175 <= iVar141 * 0xd) {
            iVar174 = iVar178;
          }
          iVar178 = 0x800;
          if (iVar170 == iVar137 * 8 || SBORROW4(iVar170,iVar137 * 8) != iVar170 + iVar137 * -8 < 0)
          {
            iVar178 = (uint)(iVar170 != iVar137 * 3 &&
                            SBORROW4(iVar170,iVar137 * 3) == iVar170 + iVar137 * -3 < 0) << 10;
          }
          iVar141 = 0xc00;
          if (iVar170 <= iVar137 * 0xd) {
            iVar141 = iVar178;
          }
          uVar148 = 0x20;
          if (iVar157 == iVar139 * 8 || SBORROW4(iVar157,iVar139 * 8) != iVar157 + iVar139 * -8 < 0)
          {
            uVar148 = (uint)(iVar157 != iVar139 * 3 &&
                            SBORROW4(iVar157,iVar139 * 3) == iVar157 + iVar139 * -3 < 0) << 4;
          }
          uVar142 = 0x30;
          if (iVar157 <= iVar139 * 0xd) {
            uVar142 = uVar148;
          }
          uVar148 = 0x80;
          if (iVar179 == iVar5 * 8 || SBORROW4(iVar179,iVar5 * 8) != iVar179 + iVar5 * -8 < 0) {
            uVar148 = (uint)(iVar5 * 3 < iVar179) << 6;
          }
          uVar158 = 0xc0;
          if (iVar179 <= iVar5 * 0xd) {
            uVar158 = uVar148;
          }
          uVar148 = 0x2000;
          if (iVar156 == iVar144 * 8 || SBORROW4(iVar156,iVar144 * 8) != iVar156 + iVar144 * -8 < 0)
          {
            uVar148 = (uint)(iVar144 * 3 < iVar156) << 0xc;
          }
          uVar163 = 0x3000;
          if (iVar156 <= iVar144 * 0xd) {
            uVar163 = uVar148;
          }
          uVar148 = 0x8000;
          if (iVar162 == iVar136 * 8 || SBORROW4(iVar162,iVar136 * 8) != iVar162 + iVar136 * -8 < 0)
          {
            uVar148 = (uint)(iVar136 * 3 < iVar162) << 0xe;
          }
          uVar176 = 0xc000;
          if (iVar162 == iVar136 * 0xd ||
              SBORROW4(iVar162,iVar136 * 0xd) != iVar162 + iVar136 * -0xd < 0) {
            uVar176 = uVar148;
          }
          uVar148 = 0x20000;
          if (iVar167 == iVar155 * 8 || SBORROW4(iVar167,iVar155 * 8) != iVar167 + iVar155 * -8 < 0)
          {
            uVar148 = (uint)(iVar155 * 3 < iVar167) << 0x10;
          }
          uVar138 = 0x30000;
          if (iVar167 == iVar155 * 0xd ||
              SBORROW4(iVar167,iVar155 * 0xd) != iVar167 + iVar155 * -0xd < 0) {
            uVar138 = uVar148;
          }
          uVar148 = 0x80000;
          if (iVar166 == iVar153 * 8 || SBORROW4(iVar166,iVar153 * 8) != iVar166 + iVar153 * -8 < 0)
          {
            uVar148 = (uint)(iVar153 * 3 < iVar166) << 0x12;
          }
          uVar161 = 0xc0000;
          if (iVar166 == iVar153 * 0xd ||
              SBORROW4(iVar166,iVar153 * 0xd) != iVar166 + iVar153 * -0xd < 0) {
            uVar161 = uVar148;
          }
          uVar148 = 0x2000000;
          if (iVar188 == iVar184 * 8 || SBORROW4(iVar188,iVar184 * 8) != iVar188 + iVar184 * -8 < 0)
          {
            uVar148 = (uint)(iVar184 * 3 < iVar188) << 0x18;
          }
          uVar164 = 0x3000000;
          if (iVar188 == iVar184 * 0xd ||
              SBORROW4(iVar188,iVar184 * 0xd) != iVar188 + iVar184 * -0xd < 0) {
            uVar164 = uVar148;
          }
          uVar148 = 0x8000000;
          if (iVar150 == iVar140 * 8 || SBORROW4(iVar150,iVar140 * 8) != iVar150 + iVar140 * -8 < 0)
          {
            uVar148 = (uint)(iVar140 * 3 < iVar150) << 0x1a;
          }
          uVar168 = 0xc000000;
          if (iVar150 == iVar140 * 0xd ||
              SBORROW4(iVar150,iVar140 * 0xd) != iVar150 + iVar140 * -0xd < 0) {
            uVar168 = uVar148;
          }
          uVar148 = 0x200000;
          if (iVar187 == iVar186 * 8 || SBORROW4(iVar187,iVar186 * 8) != iVar187 + iVar186 * -8 < 0)
          {
            uVar148 = (uint)(iVar186 * 3 < iVar187) << 0x14;
          }
          uVar171 = 0x300000;
          if (iVar187 == iVar186 * 0xd ||
              SBORROW4(iVar187,iVar186 * 0xd) != iVar187 + iVar186 * -0xd < 0) {
            uVar171 = uVar148;
          }
          uVar148 = 0x800000;
          if (iVar182 == iVar173 * 8 || SBORROW4(iVar182,iVar173 * 8) != iVar182 + iVar173 * -8 < 0)
          {
            uVar148 = (uint)(iVar173 * 3 < iVar182) << 0x16;
          }
          uVar146 = 0xc00000;
          if (iVar182 == iVar173 * 0xd ||
              SBORROW4(iVar182,iVar173 * 0xd) != iVar182 + iVar173 * -0xd < 0) {
            uVar146 = uVar148;
          }
          uVar148 = 0x20000000;
          if (iVar183 == iVar4 * 8 || SBORROW4(iVar183,iVar4 * 8) != iVar183 + iVar4 * -8 < 0) {
            uVar148 = (uint)(iVar4 * 3 < iVar183) << 0x1c;
          }
          uVar185 = 0x30000000;
          if (iVar183 == iVar4 * 0xd || SBORROW4(iVar183,iVar4 * 0xd) != iVar183 + iVar4 * -0xd < 0)
          {
            uVar185 = uVar148;
          }
          uVar148 = 0x80000000;
          if (iVar149 == iVar3 * 8 || SBORROW4(iVar149,iVar3 * 8) != iVar149 + iVar3 * -8 < 0) {
            uVar148 = (uint)(iVar3 * 3 < iVar149) << 0x1e;
          }
          uVar151 = 0xc0000000;
          if (iVar149 <= iVar3 * 0xd) {
            uVar151 = uVar148;
          }
          *(uint *)((long)pDst_blocks + (ulong)uVar125 * 8) =
               uVar146 | uVar185 | uVar151 |
               uVar138 | uVar161 | uVar164 | uVar168 | uVar171 |
               uVar142 | uVar158 | uVar163 | uVar176 | iVar154 + uVar165 + iVar174 + iVar141;
          local_290 = (ulong)local_144;
          pVar48 = pVar172;
          aVar114 = aVar169;
          aVar169.m = aVar126.m;
          aVar115 = aVar143;
          aVar143.m = aVar128.m;
          aVar116 = aVar117;
          local_150 = local_140;
          local_144 = uVar129;
          aVar117.m = aVar130.m;
          local_140 = uVar131;
          local_148 = uVar127;
        }
        temp.m_endpoints = uVar124;
        temp.m_modulation = uVar123;
        block_pixels[0].field_0 = aVar114;
        block_pixels[1].field_0 = aVar115;
        block_pixels[2].field_0 = aVar116;
        block_pixels[4].field_0 = aVar169;
        block_pixels[5].field_0 = aVar143;
        block_pixels[6].field_0 = aVar117;
        block_pixels[8].field_0 = aVar126;
        block_pixels[9].field_0 = aVar128;
        block_pixels[10].field_0 = aVar130;
        uVar134 = uVar165;
        uVar152 = (ulong)(uVar135 + 1);
      }
      uVar134 = 1;
LAB_00129b9e:
      free(temp_endpoints.m_p);
    }
  }
  return SUB41(uVar134,0);
}

Assistant:

bool transcode_uastc_to_pvrtc1_4_rgba(const uastc_block* pSrc_blocks, void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, bool high_quality)
	{
		BASISU_NOTE_UNUSED(high_quality);

		if ((!num_blocks_x) || (!num_blocks_y))
			return false;

		const uint32_t width = num_blocks_x * 4;
		const uint32_t height = num_blocks_y * 4;
		if (!basisu::is_pow2(width) || !basisu::is_pow2(height))
			return false;

		basisu::vector<uint32_t> temp_endpoints(num_blocks_x * num_blocks_y);

		for (uint32_t y = 0; y < num_blocks_y; y++)
		{
			for (uint32_t x = 0; x < num_blocks_x; x++)
			{
				color32 block_pixels[16];
				if (!unpack_uastc(pSrc_blocks[x + y * num_blocks_x], block_pixels, false))
					return false;

				// Get block's RGBA bounding box 
				color32 low_color(255, 255, 255, 255), high_color(0, 0, 0, 0);

				for (uint32_t i = 0; i < 16; i++)
				{
					low_color = color32::comp_min(low_color, block_pixels[i]);
					high_color = color32::comp_max(high_color, block_pixels[i]);
				}

				// Set PVRTC1 endpoints to floor/ceil of bounding box's coordinates.
				pvrtc4_block temp;
				temp.set_endpoint_floor(0, low_color);
				temp.set_endpoint_ceil(1, high_color);

				temp_endpoints[x + y * num_blocks_x] = temp.m_endpoints;
			}
		}

		fixup_pvrtc1_4_modulation_rgba(pSrc_blocks, &temp_endpoints[0], pDst_blocks, num_blocks_x, num_blocks_y);

		return true;
	}